

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  file_type fVar2;
  error_code *ec_00;
  string_type *psVar3;
  error_code *in_RSI;
  path *in_RDI;
  error_code eVar4;
  error_code tmp_ec;
  file_status fs;
  error_code tec;
  string_type part;
  iterator __end2;
  iterator __begin2;
  path *__range2;
  path folders;
  size_type rootPathLen;
  bool didCreate;
  path current;
  iterator *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe44;
  byte in_stack_fffffffffffffe46;
  byte in_stack_fffffffffffffe47;
  path *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  format in_stack_fffffffffffffe54;
  string_type *in_stack_fffffffffffffe58;
  file_status in_stack_fffffffffffffe60;
  error_code *in_stack_fffffffffffffe68;
  path *in_stack_fffffffffffffe70;
  file_status local_188;
  file_status local_180;
  error_code local_178;
  string local_168 [36];
  int local_144;
  iterator local_f8;
  undefined1 *local_b0;
  string local_a8 [32];
  undefined1 local_88 [32];
  string local_68 [32];
  _Alloc_hider *local_48;
  byte local_39;
  error_code *local_18;
  path *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  path::path((path *)0x28de34);
  std::error_code::clear
            ((error_code *)
             CONCAT17(in_stack_fffffffffffffe47,
                      CONCAT16(in_stack_fffffffffffffe46,
                               CONCAT24(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))));
  local_39 = 0;
  ec_00 = (error_code *)path::root_name_length(in_stack_fffffffffffffe48);
  bVar1 = path::has_root_directory
                    ((path *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  local_48 = &((impl_string_type *)&ec_00->_M_value)->_M_dataplus + bVar1;
  psVar3 = path::native_abi_cxx11_(local_10);
  std::__cxx11::string::substr((ulong)local_68,(ulong)psVar3);
  path::operator=((path *)CONCAT17(in_stack_fffffffffffffe47,
                                   CONCAT16(in_stack_fffffffffffffe46,
                                            CONCAT24(in_stack_fffffffffffffe44,
                                                     in_stack_fffffffffffffe40))),
                  (string_type *)in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::substr((ulong)local_a8,(ulong)local_10);
  path::path((path *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
  std::__cxx11::string::~string(local_a8);
  local_b0 = local_88;
  path::begin((path *)in_stack_fffffffffffffe58);
  path::end((path *)in_stack_fffffffffffffe58);
  while (bVar1 = path::iterator::operator!=
                           ((iterator *)
                            CONCAT17(in_stack_fffffffffffffe47,
                                     CONCAT16(in_stack_fffffffffffffe46,
                                              CONCAT24(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40))),
                            in_stack_fffffffffffffe38), bVar1) {
    path::iterator::operator*(&local_f8);
    path::operator_cast_to_string((path *)ec_00);
    path::operator/=((path *)CONCAT17(in_stack_fffffffffffffe47,
                                      CONCAT16(in_stack_fffffffffffffe46,
                                               CONCAT24(in_stack_fffffffffffffe44,
                                                        in_stack_fffffffffffffe40))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe38);
    std::error_code::error_code
              ((error_code *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,
                                 CONCAT24(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))));
    status((path *)in_stack_fffffffffffffe58,
           (error_code *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    bVar1 = std::error_code::operator_cast_to_bool(&local_178);
    if ((bVar1) && (fVar2 = file_status::type(&local_180), fVar2 != not_found)) {
      local_18->_M_value = local_178._M_value;
      *(undefined4 *)&local_18->field_0x4 = local_178._4_4_;
      local_18->_M_cat = local_178._M_cat;
      local_1 = 0;
      local_144 = 1;
    }
    else {
      file_status::file_status(&local_188,&local_180);
      bVar1 = exists((file_status *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      in_stack_fffffffffffffe47 = bVar1 ^ 0xff;
      file_status::~file_status(&local_188);
      if ((in_stack_fffffffffffffe47 & 1) == 0) {
        file_status::file_status((file_status *)&stack0xfffffffffffffe60,&local_180);
        bVar1 = is_directory((file_status *)0x28e0ee);
        in_stack_fffffffffffffe46 = bVar1 ^ 0xff;
        file_status::~file_status((file_status *)&stack0xfffffffffffffe60);
        if ((in_stack_fffffffffffffe46 & 1) != 0) {
          eVar4 = detail::make_error_code
                            (CONCAT13(in_stack_fffffffffffffe47,
                                      CONCAT12(in_stack_fffffffffffffe46,in_stack_fffffffffffffe44))
                            );
          in_stack_fffffffffffffe58 = (string_type *)eVar4._M_cat;
          in_stack_fffffffffffffe50 = eVar4._M_value;
          *(ulong *)local_18 = CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
          local_18->_M_cat = (error_category *)in_stack_fffffffffffffe58;
          local_1 = 0;
          local_144 = 1;
          goto LAB_0028e156;
        }
      }
      else {
        create_directory(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        bVar1 = std::error_code::operator_cast_to_bool(local_18);
        if (bVar1) {
          std::error_code::error_code
                    ((error_code *)
                     CONCAT17(in_stack_fffffffffffffe47,
                              CONCAT16(in_stack_fffffffffffffe46,
                                       CONCAT24(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                                      )));
          bVar1 = is_directory((path *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                               ,ec_00);
          if (!bVar1) {
            local_1 = 0;
            local_144 = 1;
            goto LAB_0028e156;
          }
          std::error_code::clear
                    ((error_code *)
                     CONCAT17(in_stack_fffffffffffffe47,
                              CONCAT16(in_stack_fffffffffffffe46,
                                       CONCAT24(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                                      )));
        }
        local_39 = 1;
      }
      local_144 = 0;
    }
LAB_0028e156:
    file_status::~file_status(&local_180);
    if (local_144 == 0) {
      local_144 = 0;
    }
    std::__cxx11::string::~string(local_168);
    if (local_144 != 0) goto LAB_0028e1a5;
    path::iterator::operator++
              ((iterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  }
  local_144 = 2;
LAB_0028e1a5:
  path::iterator::~iterator((iterator *)0x28e1b2);
  path::iterator::~iterator((iterator *)0x28e1bf);
  if (local_144 == 2) {
    local_1 = local_39 & 1;
    local_144 = 1;
  }
  path::~path((path *)0x28e1f5);
  path::~path((path *)0x28e202);
  return (bool)(local_1 & 1);
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    auto rootPathLen = p._prefixLength + p.root_name_length() + (p.has_root_directory() ? 1 : 0);
    current = p.native().substr(0, rootPathLen);
    path folders(p._path.substr(rootPathLen));
    for (path::string_type part : folders) {
        current /= part;
        std::error_code tec;
        auto fs = status(current, tec);
        if (tec && fs.type() != file_type::not_found) {
            ec = tec;
            return false;
        }
        if (!exists(fs)) {
            create_directory(current, ec);
            if (ec) {
                std::error_code tmp_ec;
                if (is_directory(current, tmp_ec)) {
                    ec.clear();
                }
                else {
                    return false;
                }
            }
            didCreate = true;
        }
#ifndef LWG_2935_BEHAVIOUR
        else if (!is_directory(fs)) {
            ec = detail::make_error_code(detail::portable_error::exists);
            return false;
        }
#endif
    }
    return didCreate;
}